

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBoxAlgo.h
# Opt level: O0

void Imath_3_2::affineTransform<float,float>
               (Box<Imath_3_2::Vec3<float>_> *box,Matrix44<float> *m,
               Box<Imath_3_2::Vec3<float>_> *result)

{
  bool bVar1;
  float *pfVar2;
  Vec3<float> *in_RDX;
  Matrix44<float> *in_RSI;
  Box<Imath_3_2::Vec3<float>_> *in_RDI;
  float fVar3;
  float fVar4;
  float b;
  float a;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_20;
  int local_1c;
  
  bVar1 = Box<Imath_3_2::Vec3<float>_>::isEmpty(in_RDI);
  if (bVar1) {
    Box<Imath_3_2::Vec3<float>_>::makeEmpty
              ((Box<Imath_3_2::Vec3<float>_> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  else {
    bVar1 = Box<Imath_3_2::Vec3<float>_>::isInfinite
                      ((Box<Imath_3_2::Vec3<float>_> *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    if (bVar1) {
      Box<Imath_3_2::Vec3<float>_>::makeInfinite
                ((Box<Imath_3_2::Vec3<float>_> *)
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    }
    else {
      for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
        pfVar2 = Matrix44<float>::operator[](in_RSI,3);
        fVar3 = pfVar2[local_1c];
        pfVar2 = Vec3<float>::operator[](in_RDX + 1,local_1c);
        *pfVar2 = fVar3;
        pfVar2 = Vec3<float>::operator[](in_RDX,local_1c);
        *pfVar2 = fVar3;
        for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
          pfVar2 = Matrix44<float>::operator[](in_RSI,local_20);
          fVar3 = pfVar2[local_1c];
          pfVar2 = Vec3<float>::operator[](&in_RDI->min,local_20);
          fVar3 = fVar3 * *pfVar2;
          pfVar2 = Matrix44<float>::operator[](in_RSI,local_20);
          fVar4 = pfVar2[local_1c];
          pfVar2 = Vec3<float>::operator[](&in_RDI->max,local_20);
          fVar4 = fVar4 * *pfVar2;
          if (fVar4 <= fVar3) {
            pfVar2 = Vec3<float>::operator[](in_RDX,local_1c);
            *pfVar2 = fVar4 + *pfVar2;
            pfVar2 = Vec3<float>::operator[](in_RDX + 1,local_1c);
            *pfVar2 = fVar3 + *pfVar2;
          }
          else {
            pfVar2 = Vec3<float>::operator[](in_RDX,local_1c);
            *pfVar2 = fVar3 + *pfVar2;
            pfVar2 = Vec3<float>::operator[](in_RDX + 1,local_1c);
            *pfVar2 = fVar4 + *pfVar2;
          }
        }
      }
    }
  }
  return;
}

Assistant:

IMATH_HOSTDEVICE void
affineTransform (
    const Box<Vec3<S>>& box,
    const Matrix44<T>&  m,
    Box<Vec3<S>>&       result) IMATH_NOEXCEPT
{
    if (box.isEmpty ())
    {
        result.makeEmpty ();
        return;
    }

    if (box.isInfinite ())
    {
        result.makeInfinite ();
        return;
    }

    for (int i = 0; i < 3; i++)
    {
        result.min[i] = result.max[i] = (S) m[3][i];

        for (int j = 0; j < 3; j++)
        {
            S a, b;

            a = (S) m[j][i] * box.min[j];
            b = (S) m[j][i] * box.max[j];

            if (a < b)
            {
                result.min[i] += a;
                result.max[i] += b;
            }
            else
            {
                result.min[i] += b;
                result.max[i] += a;
            }
        }
    }
}